

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

int assert_f32_eq(float a,float b,char *testcase,int line)

{
  uint in_ESI;
  undefined8 in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  int err;
  
  test_counter = test_counter + 1;
  if ((in_XMM0_Da != in_XMM1_Da) == 0) {
    printf("ok %d - %s...\n",(ulong)(uint)test_counter,in_RDI);
  }
  else {
    printf("not ok %d - %s...\n",(ulong)(uint)test_counter,in_RDI);
    printf("# Expected %f, but observed %f instead (line %d)\n",(double)in_XMM0_Da,
           (double)in_XMM1_Da,(ulong)in_ESI);
    global_err = global_err + 1;
  }
  return (uint)(in_XMM0_Da != in_XMM1_Da);
}

Assistant:

int assert_f32_eq(float a, float b,const char *testcase, int line)
{
    test_counter++;
    int err = a!=b;
    if(err) {
        printf("not ok %d - %s...\n", test_counter, testcase);
        printf("# Expected %f, but observed %f instead (line %d)\n", a, b, line);
        global_err++;
    } else
        printf("ok %d - %s...\n", test_counter, testcase);
    return err;
}